

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Cache.cpp
# Opt level: O2

void __thiscall Cache::printInfo(Cache *this,bool verbose)

{
  pointer pBVar1;
  undefined8 in_RAX;
  long lVar2;
  undefined7 in_register_00000031;
  char *pcVar3;
  char *pcVar4;
  int j;
  ulong uVar5;
  
  puts("---------- Cache Info -----------");
  printf("Cache Size: %d bytes\n",(ulong)(this->policy).cacheSize);
  printf("Block Size: %d bytes\n",(ulong)(this->policy).blockSize);
  printf("Block Num: %d\n",(ulong)(this->policy).blockNum);
  printf("Associativiy: %d\n",(ulong)(this->policy).associativity);
  printf("Hit Latency: %d\n",(ulong)(this->policy).hitLatency);
  printf("Miss Latency: %d\n",(ulong)(this->policy).missLatency);
  if ((int)CONCAT71(in_register_00000031,verbose) != 0) {
    lVar2 = 0;
    uVar5 = 0;
    while( true ) {
      pBVar1 = (this->blocks).super__Vector_base<Cache::Block,_std::allocator<Cache::Block>_>.
               _M_impl.super__Vector_impl_data._M_start;
      if ((ulong)(((long)(this->blocks).
                         super__Vector_base<Cache::Block,_std::allocator<Cache::Block>_>._M_impl.
                         super__Vector_impl_data._M_finish - (long)pBVar1) / 0x30) <= uVar5) break;
      pcVar3 = "invalid";
      if ((&pBVar1->valid)[lVar2] != false) {
        pcVar3 = "valid";
      }
      pcVar4 = "unmodified";
      if ((&pBVar1->modified)[lVar2] != false) {
        pcVar4 = "modified";
      }
      in_RAX = CONCAT44((int)((ulong)in_RAX >> 0x20),
                        *(undefined4 *)((long)&pBVar1->lastReference + lVar2));
      printf("Block %d: tag 0x%x id %d %s %s (last ref %d)\n",uVar5 & 0xffffffff,
             (ulong)*(uint *)((long)&pBVar1->tag + lVar2),
             (ulong)*(uint *)((long)&pBVar1->id + lVar2),pcVar3,pcVar4,in_RAX);
      uVar5 = uVar5 + 1;
      lVar2 = lVar2 + 0x30;
    }
  }
  return;
}

Assistant:

void Cache::printInfo(bool verbose) {
  printf("---------- Cache Info -----------\n");
  printf("Cache Size: %d bytes\n", this->policy.cacheSize);
  printf("Block Size: %d bytes\n", this->policy.blockSize);
  printf("Block Num: %d\n", this->policy.blockNum);
  printf("Associativiy: %d\n", this->policy.associativity);
  printf("Hit Latency: %d\n", this->policy.hitLatency);
  printf("Miss Latency: %d\n", this->policy.missLatency);

  if (verbose) {
    for (int j = 0; j < this->blocks.size(); ++j) {
      const Block &b = this->blocks[j];
      printf("Block %d: tag 0x%x id %d %s %s (last ref %d)\n", j, b.tag, b.id,
             b.valid ? "valid" : "invalid",
             b.modified ? "modified" : "unmodified", b.lastReference);
      // printf("Data: ");
      // for (uint8_t d : b.data)
      // printf("%d ", d);
      // printf("\n");
    }
  }
}